

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CMU462::MeshResampler::resample(MeshResampler *this,HalfedgeMesh *mesh)

{
  bool bVar1;
  int iVar2;
  Size SVar3;
  pointer pEVar4;
  HalfedgeIter *pHVar5;
  pointer pHVar6;
  EdgeIter *pEVar7;
  pointer pVVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  VertexIter ver_1;
  Vector3D v;
  Vector3D p;
  Vector3D c;
  Vector3D N;
  double w;
  VertexIter ver;
  int after;
  int before;
  int b2;
  int b1;
  int a2;
  int a1;
  EdgeIter e_2;
  EdgeIter deleted_edge_2;
  EdgeIter deleted_edge_1;
  HalfedgeIter halfedge2;
  HalfedgeIter halfedge1;
  bool keep_going;
  EdgeIter e_next;
  int i_1;
  EdgeIter e_1;
  int n;
  int i;
  EdgeIter e;
  double L;
  pointer in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  _Self in_stack_fffffffffffffdf8;
  VertexIter in_stack_fffffffffffffe00;
  _Self local_1f8;
  _List_node_base *local_1f0;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  HalfedgeMesh *in_stack_fffffffffffffe50;
  EdgeIter in_stack_fffffffffffffe58;
  Edge *in_stack_fffffffffffffe60;
  Vector3D local_188;
  Vector3D local_170;
  undefined1 local_158 [24];
  HalfedgeMesh *in_stack_fffffffffffffec0;
  EdgeIter in_stack_fffffffffffffec8;
  _Self local_120;
  _Self local_118;
  _List_node_base *local_110;
  _List_node_base *local_108;
  _List_node_base *local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  _Self local_e0;
  _Self local_d8;
  _Self local_d0;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  _Self local_b0;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  _Self local_98;
  _Self local_90;
  _List_node_base *local_88;
  _List_node_base *local_80;
  undefined7 in_stack_ffffffffffffff88;
  byte bVar13;
  _List_iterator<CMU462::Edge> local_70;
  _List_node_base *local_68;
  _List_node_base *local_60;
  _List_node_base *local_58;
  _List_node_base *local_50;
  int local_44;
  _List_iterator<CMU462::Edge> local_40;
  int local_38;
  int local_34;
  _List_node_base *local_30;
  _Self local_28;
  _Self local_20;
  double local_18;
  
  local_18 = 0.0;
  local_20._M_node =
       (_List_node_base *)HalfedgeMesh::edgesBegin((HalfedgeMesh *)in_stack_fffffffffffffde8);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)HalfedgeMesh::edgesEnd((HalfedgeMesh *)in_stack_fffffffffffffde8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x249d65);
    dVar11 = Edge::length(in_stack_fffffffffffffe60);
    local_18 = dVar11 + local_18;
    local_30 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_20,0);
  }
  SVar3 = HalfedgeMesh::nEdges((HalfedgeMesh *)0x249da5);
  auVar12._8_4_ = (int)(SVar3 >> 0x20);
  auVar12._0_8_ = SVar3;
  auVar12._12_4_ = 0x45300000;
  local_18 = local_18 /
             ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)SVar3) - 4503599627370496.0));
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    SVar3 = HalfedgeMesh::nEdges((HalfedgeMesh *)0x249e08);
    local_38 = (int)SVar3;
    local_40._M_node =
         (_List_node_base *)HalfedgeMesh::edgesBegin((HalfedgeMesh *)in_stack_fffffffffffffde8);
    for (local_44 = 0; local_44 < local_38; local_44 = local_44 + 1) {
      std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x249e50);
      dVar11 = Edge::length(in_stack_fffffffffffffe60);
      if ((local_18 * 4.0) / 3.0 < dVar11) {
        local_50 = local_40._M_node;
        local_58 = (_List_node_base *)
                   HalfedgeMesh::splitEdge(in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
      }
      local_60 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_40,0);
    }
    local_70._M_node =
         (_List_node_base *)HalfedgeMesh::edgesBegin((HalfedgeMesh *)in_stack_fffffffffffffde8);
    bVar13 = 1;
    local_68 = local_70._M_node;
    local_40._M_node = local_70._M_node;
    while ((bVar13 & 1) != 0) {
      std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x249f2d);
      dVar11 = Edge::length(in_stack_fffffffffffffe60);
      if ((local_18 * 4.0) / 5.0 <= dVar11) {
        local_c8 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_40,0);
        local_d0._M_node =
             (_List_node_base *)HalfedgeMesh::edgesEnd((HalfedgeMesh *)in_stack_fffffffffffffde8);
        bVar1 = std::operator==(&local_40,&local_d0);
        if (bVar1) {
          bVar13 = 0;
        }
      }
      else {
        pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                           ((_List_iterator<CMU462::Edge> *)0x249f6c);
        pHVar5 = Edge::halfedge(pEVar4);
        local_80 = pHVar5->_M_node;
        pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                           ((_List_iterator<CMU462::Edge> *)0x249f8c);
        Edge::halfedge(pEVar4);
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        pHVar5 = Halfedge::twin(pHVar6);
        local_88 = pHVar5->_M_node;
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        Halfedge::next(pHVar6);
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        Halfedge::next(pHVar6);
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        pEVar7 = Halfedge::edge(pHVar6);
        local_90._M_node = pEVar7->_M_node;
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        Halfedge::next(pHVar6);
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        Halfedge::next(pHVar6);
        pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)
                            CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        pEVar7 = Halfedge::edge(pHVar6);
        local_98._M_node = pEVar7->_M_node;
        local_70._M_node = local_40._M_node;
        local_a0 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_70,0);
        while( true ) {
          bVar1 = std::operator==(&local_70,&local_90);
          in_stack_fffffffffffffdf7 = true;
          if (!bVar1) {
            in_stack_fffffffffffffdf7 = std::operator==(&local_70,&local_98);
          }
          if ((bool)in_stack_fffffffffffffdf7 == false) break;
          local_a8 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_70,0);
        }
        local_b0._M_node =
             (_List_node_base *)HalfedgeMesh::edgesEnd((HalfedgeMesh *)in_stack_fffffffffffffde8);
        bVar1 = std::operator==(&local_70,&local_b0);
        if (bVar1) {
          bVar13 = 0;
        }
        local_b8 = local_40._M_node;
        local_c0 = (_List_node_base *)HalfedgeMesh::collapseEdge((HalfedgeMesh *)c.x,(EdgeIter)c.y);
        local_40._M_node = local_70._M_node;
      }
    }
    local_d8._M_node =
         (_List_node_base *)HalfedgeMesh::edgesBegin((HalfedgeMesh *)in_stack_fffffffffffffde8);
    while( true ) {
      local_e0._M_node =
           (_List_node_base *)HalfedgeMesh::edgesEnd((HalfedgeMesh *)in_stack_fffffffffffffde8);
      bVar1 = std::operator!=(&local_d8,&local_e0);
      if (!bVar1) break;
      pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x24a1d6);
      Edge::halfedge(pEVar4);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::vertex(pHVar6);
      std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      SVar3 = Vertex::degree((Vertex *)in_stack_fffffffffffffe00._M_node);
      local_e4 = (int)SVar3;
      pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x24a212);
      Edge::halfedge(pEVar4);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::twin(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::vertex(pHVar6);
      std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      SVar3 = Vertex::degree((Vertex *)in_stack_fffffffffffffe00._M_node);
      local_e8 = (int)SVar3;
      pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x24a25e);
      Edge::halfedge(pEVar4);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::vertex(pHVar6);
      std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      SVar3 = Vertex::degree((Vertex *)in_stack_fffffffffffffe00._M_node);
      local_ec = (int)SVar3;
      pEVar4 = std::_List_iterator<CMU462::Edge>::operator->
                         ((_List_iterator<CMU462::Edge> *)0x24a2ba);
      Edge::halfedge(pEVar4);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::twin(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::next(pHVar6);
      pHVar6 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Halfedge::vertex(pHVar6);
      std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      SVar3 = Vertex::degree((Vertex *)in_stack_fffffffffffffe00._M_node);
      local_f0 = (int)SVar3;
      iVar2 = local_e4 + -6;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar9 = local_e8 + -6;
      if (iVar9 < 1) {
        iVar9 = -iVar9;
      }
      iVar10 = local_ec + -6;
      if (iVar10 < 1) {
        iVar10 = -iVar10;
      }
      local_f4 = local_f0 + -6;
      if (local_f4 < 1) {
        local_f4 = -local_f4;
      }
      local_f4 = iVar2 + iVar9 + iVar10 + local_f4;
      iVar2 = local_e4 + -7;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar9 = local_e8 + -7;
      if (iVar9 < 1) {
        iVar9 = -iVar9;
      }
      iVar10 = local_ec + -5;
      if (iVar10 < 1) {
        iVar10 = -iVar10;
      }
      local_f8 = local_f0 + -5;
      if (local_f8 < 1) {
        local_f8 = -local_f8;
      }
      local_f8 = iVar2 + iVar9 + iVar10 + local_f8;
      if (local_f8 < local_f4) {
        local_100 = local_d8._M_node;
        local_108 = (_List_node_base *)
                    HalfedgeMesh::flipEdge(in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
      }
      local_110 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_d8,0);
    }
    local_118._M_node =
         (_List_node_base *)HalfedgeMesh::verticesBegin((HalfedgeMesh *)in_stack_fffffffffffffde8);
    while( true ) {
      local_120._M_node =
           (_List_node_base *)HalfedgeMesh::verticesEnd((HalfedgeMesh *)in_stack_fffffffffffffde8);
      bVar1 = std::operator!=(&local_118,&local_120);
      if (!bVar1) break;
      std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)
                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Vertex::normal((Vertex *)CONCAT17(bVar13,in_stack_ffffffffffffff88));
      pVVar8 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      (**(pVVar8->super_HalfedgeElement)._vptr_HalfedgeElement)(local_158);
      pVVar8 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Vector3D::Vector3D(&local_170,&pVVar8->position);
      Vector3D::operator-((Vector3D *)in_stack_fffffffffffffdf8._M_node,
                          (Vector3D *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0))
      ;
      dVar11 = dot((Vector3D *)&stack0xfffffffffffffec0,&local_188);
      Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffe48,dVar11);
      Vector3D::operator-((Vector3D *)in_stack_fffffffffffffdf8._M_node,
                          (Vector3D *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0))
      ;
      CMU462::operator*((double *)in_stack_fffffffffffffdf8._M_node,
                        (Vector3D *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      Vector3D::operator+((Vector3D *)in_stack_fffffffffffffdf8._M_node,
                          (Vector3D *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0))
      ;
      pVVar8 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      (pVVar8->newPosition).x = local_1d0;
      (pVVar8->newPosition).y = local_1c8;
      (pVVar8->newPosition).z = local_1c0;
      local_1f0 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_118,0);
    }
    local_1f8._M_node =
         (_List_node_base *)HalfedgeMesh::verticesBegin((HalfedgeMesh *)in_stack_fffffffffffffde8);
    while( true ) {
      in_stack_fffffffffffffe00 =
           HalfedgeMesh::verticesEnd((HalfedgeMesh *)in_stack_fffffffffffffde8);
      bVar1 = std::operator!=(&local_1f8,(_Self *)&stack0xfffffffffffffe00);
      if (!bVar1) break;
      in_stack_fffffffffffffde8 =
           std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)
                      CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      pVVar8 = std::_List_iterator<CMU462::Vertex>::operator->
                         ((_List_iterator<CMU462::Vertex> *)
                          CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      (pVVar8->position).x = (in_stack_fffffffffffffde8->newPosition).x;
      (pVVar8->position).y = (in_stack_fffffffffffffde8->newPosition).y;
      (pVVar8->position).z = (in_stack_fffffffffffffde8->newPosition).z;
      in_stack_fffffffffffffdf8 = std::_List_iterator<CMU462::Vertex>::operator++(&local_1f8,0);
    }
  }
  return;
}

Assistant:

void MeshResampler::resample(HalfedgeMesh& mesh) {
	// TODO: (meshEdit)
	// Compute the mean edge length.
	double L = 0.0;
	for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
		L += e->length();
	}
	L /= mesh.nEdges();

	// Repeat the four main steps for 5 or 6 iterations
	for (int i = 0; i < 5; i++) {
		// -> Split edges much longer than the target length (being careful about
		//    how the loop is written!)
		int n = mesh.nEdges();
		EdgeIter e = mesh.edgesBegin();
		for (int i = 0; i < n; i++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
			e++;
		}
		/*EdgeIter e_start = mesh.edgesBegin();
		EdgeIter e_end = mesh.edgesEnd();
		for (EdgeIter e = e_start; e != e_end; e++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
		}*/

		// -> Collapse edges much shorter than the target length.  Here we need to
		//    be EXTRA careful about advancing the loop, because many edges may have
		//    been destroyed by a collapse (which ones?)
		e = mesh.edgesBegin();
		//EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		bool keep_going = true;
		while (keep_going){
			if (e->length() < 4.0*L / 5.0) {
				HalfedgeIter halfedge1 = e->halfedge();
				HalfedgeIter halfedge2 = e->halfedge()->twin();
				EdgeIter deleted_edge_1 = halfedge1->next()->next()->edge();
				EdgeIter deleted_edge_2 = halfedge2->next()->next()->edge();

				e_next = e;
				e_next++;
				while (e_next == deleted_edge_1 || e_next == deleted_edge_2) e_next++;
				if (e_next == mesh.edgesEnd()) keep_going = false;
				mesh.collapseEdge(e);
				e = e_next;
			}
			else {
				e++;
				if (e == mesh.edgesEnd()) keep_going = false;
			}
		}

		/*vector<EdgeIter> buffer;
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			if (e->length() < 4.0*L / 5.0) buffer.push_back(e); 
		}
		for (EdgeIter e: buffer) mesh.collapseEdge(e);*/

		/*EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		for (int i = 0; i < mesh.nEdges();i++) {
			e_next++;
			if (e->length() < 4.0*L / 5.0) mesh.collapseEdge(e);
			e = e_next;
		}*/

		// -> Now flip each edge if it improves vertex degree
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			int a1 = e->halfedge()->vertex()->degree();
			int a2 = e->halfedge()->twin()->vertex()->degree();
			int b1 = e->halfedge()->next()->next()->vertex()->degree();
			int b2 = e->halfedge()->twin()->next()->next()->vertex()->degree();
			int before = abs(a1 - 6) + abs(a2 - 6) + abs(b1 - 6) + abs(b2 - 6);
			int after = abs(a1 - 1 - 6) + abs(a2 - 1 - 6) + abs(b1 + 1 - 6) + abs(b2 + 1 - 6);
			if (after < before) mesh.flipEdge(e);
		}

		// -> Finally, apply some tangential smoothing to the vertex positions
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			double w = 1.0 / 5.0;
			Vector3D N = ver->normal();
			Vector3D c = ver->centroid();
			Vector3D p = ver->position;
			Vector3D v = c - p;
			v = v - dot(N, v);
			ver->newPosition = p + w * v;
		}
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			ver->position = ver->newPosition;
		}

	}
	//showError("resample() not implemented.");
}